

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O2

int envy_bios_parse_bit_d(envy_bios *bios,envy_bios_bit_entry *bit)

{
  envy_bios_d_dp_info_entry *peVar1;
  uint8_t *puVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  envy_bios_d_dp_info_entry *peVar15;
  envy_bios_d_dp_info_before_link_speed *peVar16;
  envy_bios_d_dp_info_level_entry_table *peVar17;
  envy_bios_d_dp_info_level_entry *peVar18;
  long lVar19;
  ulong uVar20;
  char *__format;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  uint local_68;
  
  (bios->d).bit = bit;
  uVar22 = 0;
  do {
    iVar5 = parse_at(bios,uVar22,(char **)0x0);
    uVar22 = uVar22 + 1;
  } while (iVar5 == 0);
  uVar4 = (bios->d).dp_info.offset;
  if (uVar4 != 0) {
    bios_u8(bios,(uint)uVar4,&(bios->d).dp_info.version);
    bVar3 = (bios->d).dp_info.version;
    if (bVar3 - 0x40 < 2) {
      uVar6 = bios_u8(bios,(bios->d).dp_info.offset + 1,&(bios->d).dp_info.hlen);
      uVar7 = bios_u8(bios,(bios->d).dp_info.offset + 2,&(bios->d).dp_info.rlen);
      uVar8 = bios_u8(bios,(bios->d).dp_info.offset + 3,&(bios->d).dp_info.entriesnum);
      uVar9 = bios_u8(bios,(bios->d).dp_info.offset + 4,&(bios->d).dp_info.target_size);
      uVar10 = bios_u8(bios,(bios->d).dp_info.offset + 5,&(bios->d).dp_info.levelentrytables_count);
      uVar11 = bios_u8(bios,(bios->d).dp_info.offset + 6,&(bios->d).dp_info.levelentry_size);
      uVar12 = bios_u8(bios,(bios->d).dp_info.offset + 7,&(bios->d).dp_info.levelentry_count);
      uVar22 = bios_u8(bios,(bios->d).dp_info.offset + 8,&(bios->d).dp_info.flags);
      uVar22 = uVar22 | uVar12 | uVar11 | uVar10 | uVar9 | uVar8 | uVar7 | uVar6;
      (bios->d).dp_info.regular_vswing = 0;
      (bios->d).dp_info.low_vswing = 0;
    }
    else {
      if (bVar3 != 0x42) {
        __format = "Unknown d DP INFO table version 0x%x\n";
LAB_0025f76f:
        fprintf(_stderr,__format,(ulong)bVar3);
        return 0;
      }
      uVar22 = bios_u8(bios,(bios->d).dp_info.offset + 1,&(bios->d).dp_info.hlen);
      uVar6 = bios_u8(bios,(bios->d).dp_info.offset + 2,&(bios->d).dp_info.rlen);
      uVar7 = bios_u8(bios,(bios->d).dp_info.offset + 3,&(bios->d).dp_info.entriesnum);
      uVar8 = bios_u8(bios,(bios->d).dp_info.offset + 4,&(bios->d).dp_info.target_size);
      uVar9 = bios_u8(bios,(bios->d).dp_info.offset + 5,&(bios->d).dp_info.levelentrytables_count);
      uVar10 = bios_u8(bios,(bios->d).dp_info.offset + 6,&(bios->d).dp_info.levelentry_size);
      uVar11 = bios_u8(bios,(bios->d).dp_info.offset + 7,&(bios->d).dp_info.levelentry_count);
      uVar12 = bios_u8(bios,(bios->d).dp_info.offset + 8,&(bios->d).dp_info.flags);
      uVar13 = bios_u16(bios,(bios->d).dp_info.offset + 9,&(bios->d).dp_info.regular_vswing);
      uVar14 = bios_u16(bios,(bios->d).dp_info.offset + 0xb,&(bios->d).dp_info.low_vswing);
      uVar22 = uVar14 | uVar13 | uVar12 | uVar11 | uVar10 | uVar9 | uVar8 | uVar7 | uVar6 | uVar22;
    }
    (bios->d).dp_info.valid = uVar22 == 0;
    uVar20 = (ulong)(bios->d).dp_info.entriesnum;
    peVar15 = (envy_bios_d_dp_info_entry *)malloc(uVar20 * 0x28);
    (bios->d).dp_info.entries = peVar15;
    for (uVar23 = 0; uVar23 < uVar20; uVar23 = uVar23 + 1) {
      peVar1 = (bios->d).dp_info.entries;
      peVar15 = peVar1 + uVar23;
      bios_u16(bios,(int)uVar23 * (uint)(bios->d).dp_info.rlen +
                    (uint)(bios->d).dp_info.hlen + *(int *)&(bios->d).dp_info & 0xffff,
               &peVar15->offset);
      uVar4 = peVar1[uVar23].offset;
      if (uVar4 != 0) {
        uVar6 = (uint)uVar4;
        if ((uint)((ulong)uVar4 + 3) < bios->length) {
          puVar2 = bios->data;
          peVar15->key = CONCAT13(puVar2[(ulong)uVar4 + 3],
                                  CONCAT12(puVar2[(ulong)uVar6 + 2],*(undefined2 *)(puVar2 + uVar6))
                                 );
          local_68 = 0;
        }
        else {
          peVar15->key = 0;
          fprintf(_stderr,"requested OOB u32 at 0x%04x\n",(ulong)uVar6);
          uVar4 = peVar15->offset;
          local_68 = 0xfffffff2;
        }
        uVar6 = bios_u8(bios,uVar4 + 4,&peVar15->flags);
        uVar7 = bios_u16(bios,peVar15->offset + 5,&peVar15->before_link_training);
        uVar8 = bios_u16(bios,peVar15->offset + 7,&peVar15->after_link_training);
        uVar9 = bios_u16(bios,peVar15->offset + 9,&peVar15->before_link_speed_0);
        uVar10 = bios_u16(bios,peVar15->offset + 0xb,&peVar15->enable_spread);
        uVar11 = bios_u16(bios,peVar15->offset + 0xd,&peVar15->disable_spread);
        uVar12 = bios_u16(bios,peVar15->offset + 0xf,&peVar15->disable_lt);
        uVar13 = bios_u8(bios,peVar15->offset + 0x11,&peVar15->level_entry_table_index);
        uVar14 = bios_u8(bios,peVar15->offset + 0x12,&peVar15->hbr2_min_vdt_index);
        uVar22 = uVar22 | uVar13 | uVar12 | uVar14 |
                          uVar10 | uVar9 | uVar11 | uVar8 | uVar7 | uVar6 | local_68;
        peVar15->valid = uVar22 == 0;
        uVar6 = 4 - ((bios->d).dp_info.version < 0x42);
        peVar15->before_link_speed_nums = uVar6;
        peVar16 = (envy_bios_d_dp_info_before_link_speed *)malloc((ulong)(uVar6 * 6));
        peVar15->before_link_speed_entries = peVar16;
        lVar21 = 4;
        for (lVar19 = 0; (ulong)uVar6 * 3 != lVar19; lVar19 = lVar19 + 3) {
          peVar16 = peVar15->before_link_speed_entries;
          uVar4 = peVar15->before_link_speed_0 + (short)lVar19;
          (&peVar16->offset)[lVar19] = uVar4;
          uVar7 = bios_u8(bios,(uint)uVar4,(uint8_t *)((long)peVar16 + lVar21 + -1));
          uVar8 = bios_u16(bios,(&peVar16->offset)[lVar19] + 1,
                           (uint16_t *)((long)&peVar16->offset + lVar21));
          uVar22 = uVar22 | uVar8 | uVar7;
          (&peVar16->valid)[lVar19 * 2] = uVar22 == 0;
          lVar21 = lVar21 + 6;
        }
      }
      uVar20 = (ulong)(bios->d).dp_info.entriesnum;
    }
    bVar3 = (bios->d).dp_info.levelentrytables_count;
    peVar17 = (envy_bios_d_dp_info_level_entry_table *)malloc((ulong)bVar3 << 4);
    (bios->d).dp_info.level_entry_tables = peVar17;
    for (uVar20 = 0; uVar20 < bVar3; uVar20 = uVar20 + 1) {
      peVar17 = (bios->d).dp_info.level_entry_tables;
      bVar3 = (bios->d).dp_info.levelentry_count;
      peVar17[uVar20].offset =
           (ushort)(bios->d).dp_info.levelentry_size * (short)uVar20 * (ushort)bVar3 +
           (ushort)(bios->d).dp_info.rlen * (ushort)(bios->d).dp_info.entriesnum +
           (ushort)(bios->d).dp_info.hlen + (bios->d).dp_info.offset;
      peVar18 = (envy_bios_d_dp_info_level_entry *)malloc((ulong)bVar3 << 3);
      peVar17[uVar20].level_entries = peVar18;
      lVar21 = 6;
      for (uVar23 = 0; uVar23 < bVar3; uVar23 = uVar23 + 1) {
        peVar18 = peVar17[uVar20].level_entries;
        uVar4 = (short)uVar23 * (ushort)(bios->d).dp_info.levelentry_size + peVar17[uVar20].offset;
        peVar18[uVar23].offset = uVar4;
        bVar3 = (bios->d).dp_info.version;
        if (bVar3 - 0x40 < 2) {
          uVar8 = bios_u8(bios,(uint)uVar4,(uint8_t *)((long)peVar18 + lVar21 + -3));
          uVar7 = bios_u8(bios,peVar18[uVar23].offset + 1,(uint8_t *)((long)peVar18 + lVar21 + -2));
          uVar9 = bios_u8(bios,peVar18[uVar23].offset + 2,(uint8_t *)((long)peVar18 + lVar21 + -1));
          uVar6 = bios_u8(bios,peVar18[uVar23].offset + 3,
                          (uint8_t *)((long)&peVar18->offset + lVar21));
          uVar6 = uVar9 | uVar7 | uVar6;
        }
        else {
          if (bVar3 != 0x42) {
            __format = "Unknown d DP INFO LEVEL ENTRY TABLE version 0x%x\n";
            goto LAB_0025f76f;
          }
          peVar18[uVar23].post_cursor_2 = '\0';
          uVar8 = bios_u8(bios,(uint)uVar4,(uint8_t *)((long)peVar18 + lVar21 + -2));
          uVar7 = bios_u8(bios,peVar18[uVar23].offset + 1,(uint8_t *)((long)peVar18 + lVar21 + -1));
          uVar6 = bios_u8(bios,peVar18[uVar23].offset + 2,
                          (uint8_t *)((long)&peVar18->offset + lVar21));
          uVar6 = uVar6 | uVar7;
        }
        uVar22 = uVar22 | uVar6 | uVar8;
        peVar18[uVar23].valid = uVar22 == 0;
        bVar3 = (bios->d).dp_info.levelentry_count;
        lVar21 = lVar21 + 8;
      }
      bVar3 = (bios->d).dp_info.levelentrytables_count;
    }
  }
  return 0;
}

Assistant:

int
envy_bios_parse_bit_d(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_d *d = &bios->d;
	unsigned int idx = 0;

	d->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_d_dp_info(bios);

	return 0;
}